

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O1

void __thiscall
cmCursesLongMessageForm::Render
          (cmCursesLongMessageForm *this,int param_1,int param_2,int param_3,int param_4)

{
  char *pcVar1;
  char cVar2;
  FIELD *field;
  FORM *pFVar3;
  int iVar4;
  int cols;
  ulong uVar5;
  
  if (_stdscr == 0) {
    iVar4 = -7;
    cols = -3;
  }
  else {
    iVar4 = *(short *)(_stdscr + 4) + -5;
    cols = *(short *)(_stdscr + 6) + -1;
  }
  pFVar3 = (this->super_cmCursesForm).Form;
  if (pFVar3 != (FORM *)0x0) {
    unpost_form(pFVar3);
    free_form((this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  pcVar1 = (this->Messages)._M_dataplus._M_p;
  erase();
  clearok(_stdscr,1);
  if (this->Fields[0] != (FIELD *)0x0) {
    free_field(this->Fields[0]);
    this->Fields[0] = (FIELD *)0x0;
  }
  field = new_field(iVar4,cols,1,1,0,0);
  this->Fields[0] = field;
  field_opts_off(field,0x200);
  pFVar3 = new_form(this->Fields);
  (this->super_cmCursesForm).Form = pFVar3;
  post_form(pFVar3);
  form_driver((this->super_cmCursesForm).Form,0x216);
  cVar2 = *pcVar1;
  if (cVar2 != '\0') {
    uVar5 = 0;
    do {
      if ((cVar2 == '\n') && (pcVar1[uVar5 + 1] != '\0')) {
        pFVar3 = (this->super_cmCursesForm).Form;
        iVar4 = 0x21e;
      }
      else {
        pFVar3 = (this->super_cmCursesForm).Form;
        iVar4 = (int)cVar2;
      }
      form_driver(pFVar3,iVar4);
      if (0xea5e < uVar5) break;
      cVar2 = pcVar1[uVar5 + 1];
      uVar5 = uVar5 + 1;
    } while (cVar2 != '\0');
  }
  form_driver((this->super_cmCursesForm).Form,0x216);
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
  PrintKeys(this);
  if (_stdscr == 0) {
    iVar4 = -1;
  }
  else {
    iVar4 = *(short *)(_stdscr + 4) + 1;
  }
  wtouchln(_stdscr,0,iVar4,1);
  refresh();
  return;
}

Assistant:

void cmCursesLongMessageForm::Render(int, int, int, int)
{
  int x,y;
  getmaxyx(stdscr, y, x);

  if (this->Form)
    {
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = 0;
    }

  const char* msg = this->Messages.c_str();

  curses_clear();

  if (this->Fields[0])
    {
    free_field(this->Fields[0]);
    this->Fields[0] = 0;
    }

  this->Fields[0] = new_field(y-6, x-2, 1, 1, 0, 0);

  field_opts_off(this->Fields[0],  O_STATIC);

  this->Form = new_form(this->Fields);
  post_form(this->Form);

  int i=0;
  form_driver(this->Form, REQ_BEG_FIELD);
  while(msg[i] != '\0' && i < 60000)
    {
    if (msg[i] == '\n' && msg[i+1] != '\0')
      {
      form_driver(this->Form, REQ_NEW_LINE);
      }
    else
      {
      form_driver(this->Form, msg[i]);
      }
    i++;
    }
  form_driver(this->Form, REQ_BEG_FIELD);

  this->UpdateStatusBar();
  this->PrintKeys();
  touchwin(stdscr);
  refresh();

}